

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PlanningUnitMADPDiscrete.cpp
# Opt level: O1

LIndex __thiscall PlanningUnitMADPDiscrete::GetNrJointPolicies(PlanningUnitMADPDiscrete *this)

{
  int iVar1;
  undefined4 extraout_var;
  LIndex LVar2;
  undefined4 extraout_var_00;
  EOverflow *this_00;
  ulong uVar3;
  ulong uVar4;
  
  iVar1 = (*(this->super_PlanningUnit)._vptr_PlanningUnit[6])();
  if (CONCAT44(extraout_var,iVar1) == 0) {
    LVar2 = 1;
  }
  else {
    uVar3 = 0;
    uVar4 = 1;
    do {
      LVar2 = GetNrPolicies(this,(Index)uVar3);
      LVar2 = LVar2 * uVar4;
      if (LVar2 < uVar4) {
        this_00 = (EOverflow *)__cxa_allocate_exception(0x28);
        EOverflow::EOverflow
                  (this_00,"PlanningUnitMADPDiscrete::GetNrJointPolicies() overflow detected");
        __cxa_throw(this_00,&EOverflow::typeinfo,E::~E);
      }
      uVar3 = (ulong)((Index)uVar3 + 1);
      iVar1 = (*(this->super_PlanningUnit)._vptr_PlanningUnit[6])(this);
      uVar4 = LVar2;
    } while (uVar3 < CONCAT44(extraout_var_00,iVar1));
  }
  return LVar2;
}

Assistant:

LIndex PlanningUnitMADPDiscrete::GetNrJointPolicies() const
{
    LIndex n=1;
    for(Index ag=0; ag < GetNrAgents(); ag++)
    {
        LIndex nOld=n;
        n *= GetNrPolicies(ag);
        if(n<nOld)
            throw(EOverflow("PlanningUnitMADPDiscrete::GetNrJointPolicies() overflow detected"));
    }
    return(n);
}